

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_workgroup_initialization(CompilerMSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  spirv_cross local_138 [8];
  string var_ptr2_name;
  spirv_cross local_118 [8];
  string var_stride_name;
  spirv_cross local_f8 [8];
  string var_pos_name;
  spirv_cross local_d8 [8];
  string var_size_name;
  spirv_cross local_b8 [8];
  string var_ptr_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [8];
  string var_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  byte local_21;
  SPIRType *pSStack_20;
  bool is_boolean;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerMSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  pSStack_20 = Compiler::get_variable_data_type((Compiler *)this,var);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  bVar1 = VectorView<unsigned_int>::empty(&(pSStack_20->array).super_VectorView<unsigned_int>);
  if ((bVar1) &&
     (bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                        (&(pSStack_20->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>), bVar1)) {
    local_21 = pSStack_20->basetype == Boolean;
    if ((bool)local_21) {
      pSStack_20->basetype = Short;
    }
    CompilerGLSL::statement<char_const(&)[34]>
              (&this->super_CompilerGLSL,(char (*) [34])"if (gl_LocalInvocationIndex == 0)");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_48,this,(ulong)uVar2,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3a])(local_68,this,type);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_48,(char (*) [4])0x4247a7,local_68,
               (char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)local_68);
    ::std::__cxx11::string::~string((string *)local_48);
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    if ((local_21 & 1) != 0) {
      pSStack_20->basetype = Boolean;
    }
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_98,this,(ulong)uVar2,1);
    join<std::__cxx11::string&,char_const(&)[5]>(local_b8,local_98,(char (*) [5])"_ptr");
    join<std::__cxx11::string&,char_const(&)[4]>(local_d8,local_98,(char (*) [4])"_sz");
    join<std::__cxx11::string&,char_const(&)[5]>(local_f8,local_98,(char (*) [5])"_pos");
    join<std::__cxx11::string&,char_const(&)[8]>(local_118,local_98,(char (*) [8])0x409bbb);
    join<std::__cxx11::string&,char_const(&)[6]>(local_138,local_98,(char (*) [6])"_ptr2");
    CompilerGLSL::
    statement<char_const(&)[19],std::__cxx11::string&,char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [19])"threadgroup uint *",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
               (char (*) [25])" = (threadgroup uint *)&",local_98,(char (*) [2])0x42463b);
    CompilerGLSL::
    statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[4],char_const(&)[8],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [6])"uint ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               (char (*) [4])0x4247a7,(char (*) [8])"sizeof(",local_98,(char (*) [3])0x40acad);
    CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[28]>
              (&this->super_CompilerGLSL,(char (*) [6])"uint ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [28])0x4242c1);
    CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[65]>
              (&this->super_CompilerGLSL,(char (*) [6])"uint ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               (char (*) [65])" = gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z;");
    CompilerGLSL::
    statement<char_const(&)[23],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [23])"while (sizeof(uint) * ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [4])" < ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               (char (*) [2])0x40bd22);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[8]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
               (char (*) [2])0x40f992,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [8])"] = 0u;");
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[5],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [5])" += ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
               (char (*) [2])0x42463b);
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[34]>
              (&this->super_CompilerGLSL,(char (*) [34])"if (gl_LocalInvocationIndex == 0)");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[5],std::__cxx11::string&,char_const(&)[33]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [5])0x421667,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               (char (*) [33])" / sizeof(uint)) * sizeof(uint);");
    CompilerGLSL::
    statement<char_const(&)[20],std::__cxx11::string&,char_const(&)[26],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [20])"threadgroup uchar *",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
               (char (*) [26])" = (threadgroup uchar *)&",local_98,(char (*) [2])0x42463b);
    CompilerGLSL::
    statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char (*) [8])"while (",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [4])" < ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               (char (*) [2])0x40bd22);
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[10]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
               (char (*) [2])0x40f992,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [10])"] = \'\\0\';");
    CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               (char (*) [4])"++;");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    ::std::__cxx11::string::~string((string *)local_138);
    ::std::__cxx11::string::~string((string *)local_118);
    ::std::__cxx11::string::~string((string *)local_f8);
    ::std::__cxx11::string::~string((string *)local_d8);
    ::std::__cxx11::string::~string((string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_98);
  }
  CompilerGLSL::statement<char_const(&)[49]>
            (&this->super_CompilerGLSL,
             (char (*) [49])"threadgroup_barrier(mem_flags::mem_threadgroup);");
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerMSL::emit_workgroup_initialization(const SPIRVariable &var)
{
	auto &type = get_variable_data_type(var);

	begin_scope();

	if (type.array.empty() && type.member_types.empty())
	{
		// For simple shared variables, we just initialize it in thread 0 of the block
		// We use short to represent bool for threadgroup variable to workaround compiler bug,
		// so we do a temporary fixup here. Alas. (see the type_to_glsl method)
		bool is_boolean = type.basetype == SPIRType::Boolean;
		if (is_boolean)
			type.basetype = SPIRType::Short;

		statement("if (gl_LocalInvocationIndex == 0)");
		begin_scope();
		statement(to_name(var.self), " = ", to_initializer_expression(var), ";");
		end_scope();

		if (is_boolean)
			type.basetype = SPIRType::Boolean;
	}
	else
	{
		// Otherwise, we use a loop to cooperatively initialize the memory within the group

		// First, we define a few variable names;
		string var_name = to_name(var.self);
		string var_ptr_name = join(var_name, "_ptr");
		string var_size_name = join(var_name, "_sz");
		string var_pos_name = join(var_name, "_pos");
		string var_stride_name = join(var_name, "_stride");
		string var_ptr2_name = join(var_name, "_ptr2");

		statement("threadgroup uint *", var_ptr_name, " = (threadgroup uint *)&", var_name, ";");
		statement("uint ", var_size_name, " = ", "sizeof(", var_name, ");");
		statement("uint ", var_pos_name, " = gl_LocalInvocationIndex;");
		statement("uint ", var_stride_name, " = gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z;");

		statement("while (sizeof(uint) * ", var_pos_name, " < ", var_size_name, ")");
		begin_scope();
		statement(var_ptr_name, "[", var_pos_name, "] = 0u;");
		statement(var_pos_name, " += ", var_stride_name, ";");
		end_scope();

		statement("if (gl_LocalInvocationIndex == 0)");
		begin_scope();
		statement(var_pos_name, " = (", var_size_name, " / sizeof(uint)) * sizeof(uint);");
		statement("threadgroup uchar *", var_ptr2_name, " = (threadgroup uchar *)&", var_name, ";");

		statement("while (", var_pos_name, " < ", var_size_name, ")");
		begin_scope();
		statement(var_ptr2_name, "[", var_pos_name, "] = '\\0';");
		statement(var_pos_name, "++;");
		end_scope();
		end_scope();
	}

	statement("threadgroup_barrier(mem_flags::mem_threadgroup);");

	end_scope();
}